

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O3

void __thiscall menuwindow::drawentry(menuwindow *this,Fl_Menu_Item *m,int n,int eraseit)

{
  int h;
  int x;
  int y;
  int iVar1;
  menuwindow *pmVar2;
  char *str;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int w;
  char *k;
  
  if (m == (Fl_Menu_Item *)0x0) {
    return;
  }
  x = Fl::box_dx((uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                       super_Fl_Group.super_Fl_Widget.box_);
  iVar5 = (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.super_Fl_Group.
          super_Fl_Widget.w_ + x * -2;
  iVar11 = this->itemheight;
  w = iVar5 + -1;
  y = iVar11 * n + x + 1;
  h = iVar11 + -4;
  iVar1 = this->selected;
  if (iVar1 != n && eraseit != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(x + 1),(ulong)(uint)(iVar11 * n + x),(ulong)(iVar5 - 3),
               (ulong)(iVar11 - 2));
    pmVar2 = (menuwindow *)button;
    if (button == (Fl_Menu_ *)0x0) {
      pmVar2 = this;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)(this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                              super_Fl_Group.super_Fl_Widget.box_,0,0,
                        (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                        super_Fl_Group.super_Fl_Widget.w_,
                        (this->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                        super_Fl_Group.super_Fl_Widget.h_,
                        (pmVar2->super_Fl_Menu_Window).super_Fl_Single_Window.super_Fl_Window.
                        super_Fl_Group.super_Fl_Widget.color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    iVar1 = this->selected;
  }
  Fl_Menu_Item::draw(m,x,y,w,h,button,(uint)(iVar1 == n));
  if ((m->flags & 0x60) != 0) {
    uVar6 = iVar11 - 0xbU & 0xfffffffe;
    uVar8 = (int)(h - uVar6) / 2 + y;
    uVar7 = ~uVar6 + w + x;
    iVar11 = (int)(iVar11 - 0xbU) >> 1;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x16])
              (fl_graphics_driver,(ulong)uVar7,(ulong)uVar8,(ulong)uVar7,(ulong)(uVar8 + uVar6),
               (ulong)(uVar7 + iVar11),(ulong)(iVar11 + uVar8));
    goto LAB_001be5c8;
  }
  if (m->shortcut_ == 0) goto LAB_001be5c8;
  uVar10 = (ulong)(uint)m->labelfont_;
  uVar9 = (ulong)(uint)m->labelsize_;
  if (m->labelsize_ == 0) {
    if (m->labelfont_ == 0) {
      if (button != (Fl_Menu_ *)0x0) {
        uVar10 = (ulong)(uint)button->textfont_;
        goto LAB_001be67a;
      }
    }
    else if (button != (Fl_Menu_ *)0x0) {
LAB_001be67a:
      uVar9 = (ulong)(uint)button->textsize_;
      goto LAB_001be68b;
    }
    uVar9 = (ulong)(uint)FL_NORMAL_SIZE;
  }
LAB_001be68b:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])(fl_graphics_driver,uVar10,uVar9);
  str = fl_shortcut_label(m->shortcut_,&k);
  pcVar4 = k;
  sVar3 = strlen(k);
  iVar11 = fl_utf_nb_char((uchar *)pcVar4,(int)sVar3);
  if (iVar11 < 5) {
    sVar3 = (long)k - (long)str;
    pcVar4 = (char *)malloc(sVar3 + 1);
    memcpy(pcVar4,str,sVar3);
    pcVar4[sVar3] = '\0';
    fl_draw(pcVar4,x,y,w - this->shortcutWidth,h,8,(Fl_Image *)0x0,1);
    fl_draw(k,(w + x) - this->shortcutWidth,y,this->shortcutWidth,h,4,(Fl_Image *)0x0,1);
    free(pcVar4);
  }
  else {
    fl_draw(str,x,y,iVar5 + -5,h,8,(Fl_Image *)0x0,1);
  }
LAB_001be5c8:
  if ((m->flags & 0x80) != 0) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x27);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(x - 1U),(ulong)(y + h + 1),(ulong)(iVar5 + 2U));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,0x36);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)(x - 1U),(ulong)(y + h + 2),(ulong)(iVar5 + 2U));
  }
  return;
}

Assistant:

void menuwindow::drawentry(const Fl_Menu_Item* m, int n, int eraseit) {
  if (!m) return; // this happens if -1 is selected item and redrawn

  int BW = Fl::box_dx(box());
  int xx = BW;
  int W = w();
  int ww = W-2*BW-1;
  int yy = BW+1+n*itemheight;
  int hh = itemheight - LEADING;

  if (eraseit && n != selected) {
    fl_push_clip(xx+1, yy-(LEADING-2)/2, ww-2, hh+(LEADING-2));
    draw_box(box(), 0, 0, w(), h(), button ? button->color() : color());
    fl_pop_clip();
  }

  m->draw(xx, yy, ww, hh, button, n==selected);

  // the shortcuts and arrows assume fl_color() was left set by draw():
  if (m->submenu()) {
    int sz = (hh-7)&-2;
    int y1 = yy+(hh-sz)/2;
    int x1 = xx+ww-sz-3;
    fl_polygon(x1+2, y1, x1+2, y1+sz, x1+sz/2+2, y1+sz/2);
  } else if (m->shortcut_) {
    Fl_Font f = m->labelsize_ || m->labelfont_ ? (Fl_Font)m->labelfont_ :
                    button ? button->textfont() : FL_HELVETICA;
    fl_font(f, m->labelsize_ ? m->labelsize_ :
                   button ? button->textsize() : FL_NORMAL_SIZE);
    const char *k, *s = fl_shortcut_label(m->shortcut_, &k);
    if (fl_utf_nb_char((const unsigned char*)k, (int) strlen(k))<=4) {
      // right-align the modifiers and left-align the key
      char *buf = (char*)malloc(k-s+1);
      memcpy(buf, s, k-s); buf[k-s] = 0;
      fl_draw(buf, xx, yy, ww-shortcutWidth, hh, FL_ALIGN_RIGHT);
      fl_draw(  k, xx+ww-shortcutWidth, yy, shortcutWidth, hh, FL_ALIGN_LEFT);
      free(buf);
    } else {
      // right-align to the menu
      fl_draw(s, xx, yy, ww-4, hh, FL_ALIGN_RIGHT);
    }
  }

  if (m->flags & FL_MENU_DIVIDER) {
    fl_color(FL_DARK3);
    fl_xyline(BW-1, yy+hh+(LEADING-2)/2, W-2*BW+2);
    fl_color(FL_LIGHT3);
    fl_xyline(BW-1, yy+hh+((LEADING-2)/2+1), W-2*BW+2);
  }
}